

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue_examples.cpp
# Opt level: O1

void density_tests::heterogeneous_queue_put_samples(void)

{
  int *piVar1;
  char *pcVar2;
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  put_1;
  runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue;
  runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type_3;
  put_transaction<int> put;
  undefined1 local_a8 [16];
  void *apvStack_98 [2];
  put_transaction<int> local_88;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> local_70;
  put_transaction<int> local_60;
  put_transaction<int> local_48;
  
  local_70.m_head = (ControlBlock *)&DAT_0000ffef;
  local_70.m_tail = (ControlBlock *)&DAT_0000ffef;
  local_a8._0_4_ = 0xc;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&local_70,(int *)local_a8);
  local_a8._0_8_ = apvStack_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"Hello world!!","");
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<std::__cxx11::string,std::__cxx11::string>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             &local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
            );
  if ((void **)local_a8._0_8_ != apvStack_98) {
    operator_delete((void *)local_a8._0_8_);
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  emplace<int>(&local_70);
  local_a8._0_4_ = 0xc;
  local_88.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       CONCAT71(local_88.m_queue._1_7_,0x2d);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<std::__cxx11::string,int,char>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             &local_70,(int *)local_a8,(char *)&local_88);
  join_0x00000010_0x00000000_ =
       density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
       inplace_allocate<0ul,true,4ul,4ul>
                 ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
                  &local_70);
  local_a8._8_8_[1].m_next =
       (uintptr_t)
       density::detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
       ::s_table;
  *(undefined4 *)local_a8._16_8_ = 0xc;
  local_a8._0_8_ = (pointer)0x0;
  local_88.m_queue = &local_70;
  local_88.m_put_data = join_0x00000010_0x00000000_;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_a8);
  local_60.m_queue = local_88.m_queue;
  local_88.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_60.m_put_data = local_88.m_put_data;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction(&local_88);
  local_48.m_queue = local_60.m_queue;
  local_60.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_48.m_put_data = local_60.m_put_data;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction(&local_60);
  piVar1 = (int *)density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  put_transaction<int>::element_ptr(&local_48);
  *piVar1 = *piVar1 + 2;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::commit(&local_48);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction(&local_48);
  local_48.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       CONCAT44(local_48.m_queue._4_4_,4);
  local_60.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       CONCAT71(local_60.m_queue._1_7_,0x2a);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  start_emplace<std::__cxx11::string,int,char>
            ((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_88,
             (heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             &local_70,(int *)&local_48,(char *)&local_60);
  local_a8._0_8_ = local_88.m_queue;
  local_88.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  unique0x10000896 = local_88.m_put_data;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~put_transaction((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_88);
  pcVar2 = (char *)density::
                   heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   ::
                   put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::element_ptr((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_a8);
  std::__cxx11::string::append(pcVar2);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::commit((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_a8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~put_transaction((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_a8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_70);
  local_a8._0_8_ = &DAT_0000ffef;
  local_a8._8_8_ = (ControlBlock *)&DAT_0000ffef;
  local_88.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       density::detail::
       FeatureTable<std::tuple<density::f_default_construct,density::f_destroy,density::f_size,density::f_alignment>,int>
       ::s_table;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::dyn_push((heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
              *)local_a8,
             (runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
              *)&local_88);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
             *)local_a8);
  local_88.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_88.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  local_a8._0_8_ = apvStack_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"Hello world!!","");
  local_48.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       density::detail::
       FeatureTable<std::tuple<density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,std::__cxx11::string>
       ::s_table;
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::dyn_push_copy((heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                   *)&local_88,
                  (runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                   *)&local_48,local_a8);
  if ((void **)local_a8._0_8_ != apvStack_98) {
    operator_delete((void *)local_a8._0_8_);
  }
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
             *)&local_88);
  local_88.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_88.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  local_a8._0_8_ = apvStack_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"Hello world!!","");
  local_48.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       density::detail::
       FeatureTable<std::tuple<density::f_move_construct,density::f_destroy,density::f_size,density::f_alignment>,std::__cxx11::string>
       ::s_table;
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::dyn_push_move((heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                   *)&local_88,
                  (runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                   *)&local_48,local_a8);
  if ((void **)local_a8._0_8_ != apvStack_98) {
    operator_delete((void *)local_a8._0_8_);
  }
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
             *)&local_88);
  local_48.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_48.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  local_60.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       density::detail::
       FeatureTable<std::tuple<density::f_default_construct,density::f_destroy,density::f_size,density::f_alignment>,int>
       ::s_table;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::start_dyn_push((put_transaction<void> *)&local_88,
                   (heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                    *)&local_48,
                   (runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                    *)&local_60);
  local_a8._0_8_ = local_88.m_queue;
  apvStack_98[0] = local_88.m_put_data.m_user_storage;
  local_a8._8_8_ = local_88.m_put_data.m_control_block;
  local_88.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_88);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::commit((put_transaction<void> *)local_a8);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)local_a8);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
             *)&local_48);
  local_60.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_60.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  local_a8._0_8_ = apvStack_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"Hello world!!","");
  local_70.m_head =
       (ControlBlock *)
       density::detail::
       FeatureTable<std::tuple<density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,std::__cxx11::string>
       ::s_table;
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::start_dyn_push_copy
            ((put_transaction<void> *)&local_48,
             (heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
              *)&local_60,
             (runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
              *)&local_70,local_a8);
  local_88.m_queue = local_48.m_queue;
  local_88.m_put_data.m_control_block = local_48.m_put_data.m_control_block;
  local_88.m_put_data.m_user_storage = local_48.m_put_data.m_user_storage;
  local_48.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_48);
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::commit((put_transaction<void> *)&local_88);
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_88);
  if ((void **)local_a8._0_8_ != apvStack_98) {
    operator_delete((void *)local_a8._0_8_);
  }
  density::
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
             *)&local_60);
  local_60.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_60.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  local_a8._0_8_ = apvStack_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"Hello world!!","");
  local_70.m_head =
       (ControlBlock *)
       density::detail::
       FeatureTable<std::tuple<density::f_move_construct,density::f_destroy,density::f_size,density::f_alignment>,std::__cxx11::string>
       ::s_table;
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::start_dyn_push_move
            ((put_transaction<void> *)&local_48,
             (heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
              *)&local_60,
             (runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
              *)&local_70,local_a8);
  local_88.m_queue = local_48.m_queue;
  local_88.m_put_data.m_control_block = local_48.m_put_data.m_control_block;
  local_88.m_put_data.m_user_storage = local_48.m_put_data.m_user_storage;
  local_48.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_48);
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::commit((put_transaction<void> *)&local_88);
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_88);
  if ((void **)local_a8._0_8_ != apvStack_98) {
    operator_delete((void *)local_a8._0_8_);
  }
  density::
  heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
             *)&local_60);
  return;
}

Assistant:

void heterogeneous_queue_put_samples()
    {
        using namespace density;
        {
            heter_queue<> queue;

            //! [heter_queue push example 1]
            queue.push(12);
            queue.push(std::string("Hello world!!"));
            //! [heter_queue push example 1]

            //! [heter_queue emplace example 1]
            queue.emplace<int>();
            queue.emplace<std::string>(12, '-');
            //! [heter_queue emplace example 1]

            {
                //! [heter_queue start_push example 1]
                auto put = queue.start_push(12);
                put.element() += 2;
                put.commit(); // commits a 14
                //! [heter_queue start_push example 1]
            }
            {
                //! [heter_queue start_emplace example 1]
                auto put = queue.start_emplace<std::string>(4, '*');
                put.element() += "****";
                put.commit(); // commits a "********"
                //! [heter_queue start_emplace example 1]
            }
        }
        {
            //! [heter_queue dyn_push example 1]
            using MyRunTimeType = runtime_type<f_default_construct, f_destroy, f_size, f_alignment>;
            heter_queue<MyRunTimeType> queue;

            auto const type = MyRunTimeType::make<int>();
            queue.dyn_push(type); // appends 0
            //! [heter_queue dyn_push example 1]
        }
        {
            //! [heter_queue dyn_push_copy example 1]
            using MyRunTimeType = runtime_type<f_copy_construct, f_destroy, f_size, f_alignment>;
            heter_queue<MyRunTimeType> queue;

            std::string const source("Hello world!!");
            auto const        type = MyRunTimeType::make<decltype(source)>();
            queue.dyn_push_copy(type, &source);
            //! [heter_queue dyn_push_copy example 1]
        }
        {
            //! [heter_queue dyn_push_move example 1]
            using MyRunTimeType = runtime_type<f_move_construct, f_destroy, f_size, f_alignment>;
            heter_queue<MyRunTimeType> queue;

            std::string source("Hello world!!");
            auto const  type = MyRunTimeType::make<decltype(source)>();
            queue.dyn_push_move(type, &source);
            //! [heter_queue dyn_push_move example 1]
        }

        {
            //! [heter_queue start_dyn_push example 1]
            using MyRunTimeType = runtime_type<f_default_construct, f_destroy, f_size, f_alignment>;
            heter_queue<MyRunTimeType> queue;

            auto const type = MyRunTimeType::make<int>();
            auto       put  = queue.start_dyn_push(type);
            put.commit();
            //! [heter_queue start_dyn_push example 1]
        }
        {
            //! [heter_queue start_dyn_push_copy example 1]
            using MyRunTimeType = runtime_type<f_copy_construct, f_destroy, f_size, f_alignment>;
            heter_queue<MyRunTimeType> queue;

            std::string const source("Hello world!!");
            auto const        type = MyRunTimeType::make<decltype(source)>();
            auto              put  = queue.start_dyn_push_copy(type, &source);
            put.commit();
            //! [heter_queue start_dyn_push_copy example 1]
        }
        {
            //! [heter_queue start_dyn_push_move example 1]
            using MyRunTimeType = runtime_type<f_move_construct, f_destroy, f_size, f_alignment>;
            heter_queue<MyRunTimeType> queue;

            std::string source("Hello world!!");
            auto const  type = MyRunTimeType::make<decltype(source)>();
            auto        put  = queue.start_dyn_push_move(type, &source);
            put.commit();
            //! [heter_queue start_dyn_push_move example 1]
        }
    }